

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real-offline-flexibility-estimator.cpp
# Opt level: O2

int testDerivator(void)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  Scalar *pSVar4;
  Matrix *pMVar5;
  MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *other;
  ostream *poVar6;
  int iVar7;
  int iVar8;
  double dVar9;
  double dVar10;
  IndexedMatrixArray state;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_578 [80];
  Vector x0;
  Matrix r;
  Matrix q;
  GaussianWhiteNoise MeasurementNoise;
  Vector uk;
  GaussianWhiteNoise processNoise;
  Matrix r1;
  Matrix q1;
  IndexedMatrixArray x;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_420 [80];
  IndexedMatrixArray dta;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_3c8 [232];
  IndexedMatrixArray u;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_2d8 [80];
  IndexedMatrixArray y;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_280 [80];
  ofstream f;
  
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(&x);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(&y);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(&u);
  q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  r.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  r.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  r.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  stateObservation::IMUDynamicalSystem::IMUDynamicalSystem((IMUDynamicalSystem *)&f);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity
            ((IdentityReturnType *)&state,0x12,0x12);
  _processNoise = (LhsNested)0x0;
  Eigen::
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
               *)&dta,(MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                       *)&state,(double *)&processNoise);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&q1,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&dta);
  uVar1 = stateObservation::IMUDynamicalSystem::getStateSize();
  stateObservation::GaussianWhiteNoise::GaussianWhiteNoise(&processNoise,uVar1);
  stateObservation::GaussianWhiteNoise::setStandardDeviation((Matrix *)&processNoise);
  stateObservation::IMUDynamicalSystem::setProcessNoise((NoiseBase *)&f);
  _state = (long)&q1;
  _dta = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                   ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&q1,
                    (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
                    &state);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            (&q,(Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
                 *)&dta);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity
            ((IdentityReturnType *)&state,6,6);
  _MeasurementNoise = (void *)0x0;
  Eigen::
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
               *)&dta,(MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                       *)&state,(double *)&MeasurementNoise);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&r1,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&dta);
  uVar1 = stateObservation::IMUDynamicalSystem::getMeasurementSize();
  stateObservation::GaussianWhiteNoise::GaussianWhiteNoise(&MeasurementNoise,uVar1);
  stateObservation::GaussianWhiteNoise::setStandardDeviation((Matrix *)&MeasurementNoise);
  stateObservation::IMUDynamicalSystem::setMeasurementNoise((NoiseBase *)&f);
  _state = (long)&r1;
  _dta = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                   ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&r1,
                    (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
                    &state);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            (&r,(Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
                 *)&dta);
  stateObservation::DynamicalSystemSimulator::DynamicalSystemSimulator
            ((DynamicalSystemSimulator *)&dta);
  stateObservation::DynamicalSystemSimulator::setDynamicsFunctor((DynamicalSystemFunctorBase *)&dta)
  ;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
            ((ConstantReturnType *)&state,0x12,1);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&x0,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&state);
  iVar7 = 0;
  stateObservation::DynamicalSystemSimulator::setState((Matrix *)&dta,(uint)&x0);
  for (iVar2 = 0; iVar2 != 300; iVar2 = iVar2 + 1) {
    uVar1 = stateObservation::IMUDynamicalSystem::getInputSize();
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
              ((ConstantReturnType *)&state,(ulong)uVar1,1);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&uk,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&state);
    dVar9 = (double)iVar2;
    dVar10 = sin(dVar9 * 0.3141592653589793);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&uk,0);
    *pSVar4 = dVar10 * 0.4;
    dVar10 = sin(dVar9 * 0.2617993877991494);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&uk,1);
    *pSVar4 = dVar10 * 0.6;
    dVar10 = sin(dVar9 * 0.6283185307179586);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&uk,2);
    *pSVar4 = dVar10 * 0.2;
    dVar10 = sin(dVar9 * 0.2617993877991494);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&uk,3);
    *pSVar4 = dVar10 * 10.0;
    dVar10 = sin(dVar9 * 0.20943951023931953);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&uk,4);
    *pSVar4 = dVar10 * 0.07;
    dVar9 = sin(dVar9 * 0.6283185307179586);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&uk,5);
    *pSVar4 = dVar9 * 0.05;
    for (iVar8 = 0; iVar8 != 10; iVar8 = iVar8 + 1) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&state,
                 (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&uk);
      stateObservation::IndexedMatrixArray::setValue(&u,(Matrix *)&state,iVar8 + iVar7);
      free((void *)_state);
    }
    stateObservation::DynamicalSystemSimulator::setInput
              ((Matrix *)&dta,(uint)(PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&uk);
    free(uk.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    iVar7 = iVar7 + 10;
  }
  stateObservation::IMUDynamicalSystem::setSamplingPeriod(0.001);
  stateObservation::DynamicalSystemSimulator::simulateDynamicsTo((uint)&dta);
  stateObservation::DynamicalSystemSimulator::getMeasurementArray((uint)&state,(uint)&dta);
  stateObservation::IndexedMatrixArray::operator=(&y,&state);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(local_578);
  stateObservation::DynamicalSystemSimulator::getStateArray((uint)&state,(uint)&dta);
  stateObservation::IndexedMatrixArray::operator=(&x,&state);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(local_578);
  free(x0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  stateObservation::DynamicalSystemSimulator::~DynamicalSystemSimulator
            ((DynamicalSystemSimulator *)&dta);
  stateObservation::GaussianWhiteNoise::~GaussianWhiteNoise(&MeasurementNoise);
  free(r1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  stateObservation::GaussianWhiteNoise::~GaussianWhiteNoise(&processNoise);
  free(q1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  stateObservation::IMUDynamicalSystem::~IMUDynamicalSystem((IMUDynamicalSystem *)&f);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(&dta);
  uVar1 = stateObservation::IndexedMatrixArray::getFirstIndex(&x);
  while( true ) {
    uVar3 = stateObservation::IndexedMatrixArray::getLastIndex(&x);
    if (uVar3 < uVar1) break;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero((ConstantReturnType *)&f,6,1);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&processNoise,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&f);
    pMVar5 = stateObservation::IndexedMatrixArray::operator[](&x,uVar1);
    Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((Matrix<double,_1,1,0,_1,1> *)&MeasurementNoise,pMVar5);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&f,
               (Matrix<double,__1,_1,_0,__1,_1> *)&MeasurementNoise,0,3);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head<int>
              ((Type *)&state,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&processNoise,3)
    ;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&state,
               (Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&f);
    free(_MeasurementNoise);
    pMVar5 = stateObservation::IndexedMatrixArray::operator[](&x,uVar1);
    Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((Matrix<double,_1,1,0,_1,1> *)&MeasurementNoise,pMVar5);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&f,
               (Matrix<double,__1,_1,_0,__1,_1> *)&MeasurementNoise,3,3);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::tail<int>
              ((Type *)&state,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&processNoise,3)
    ;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&state,
               (Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&f);
    free(_MeasurementNoise);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&f,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&processNoise);
    stateObservation::IndexedMatrixArray::setValue(&dta,(Matrix *)&f,uVar1);
    free((void *)_f);
    free(_processNoise);
    uVar1 = uVar1 + 1;
  }
  stateObservation::kine::reconstructStateTrajectory((kine *)&state,&dta,0.001);
  std::ofstream::ofstream(&f);
  std::ofstream::open((char *)&f,0x12c328);
  uVar1 = stateObservation::IndexedMatrixArray::getFirstIndex(&x);
  while( true ) {
    uVar3 = stateObservation::IndexedMatrixArray::getLastIndex(&x);
    if (uVar3 < uVar1) break;
    this = (MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
           stateObservation::IndexedMatrixArray::operator[](&x,uVar1);
    other = (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
            stateObservation::IndexedMatrixArray::operator[](&state,uVar1);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator-
              ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                *)&processNoise,this,other);
    poVar6 = Eigen::operator<<((ostream *)&f,
                               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                *)&processNoise);
    poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar1 = uVar1 + 1;
  }
  std::ofstream::~ofstream(&f);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(local_578);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(local_3c8);
  free(r.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(local_2d8);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(local_280);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(local_420);
  return 0;
}

Assistant:

int testDerivator()
{
    /// The number of samples
    const unsigned kmax=3000;

    ///sampling period
    const double dt=1e-3;

    ///Sizes of the states for the state, the measurement, and the input vector
    const unsigned stateSize=18;
    const unsigned measurementSize=6;
    //const unsigned inputSize=6;

    ///The array containing all the states, the measurements and the inputs
    IndexedMatrixArray x;
    IndexedMatrixArray y;
    IndexedMatrixArray u;

    ///The covariance matrix of the process noise and the measurement noise
    Matrix q;
    Matrix r;

    {
        ///simulation of the signal
        /// the IMU dynamical system functor
        IMUDynamicalSystem imu;

        ///The process noise initialization
        Matrix q1=Matrix::Identity(stateSize,stateSize)*0.00;
        GaussianWhiteNoise processNoise(imu.getStateSize());
        processNoise.setStandardDeviation(q1);
        imu.setProcessNoise( & processNoise );
        q=q1*q1.transpose();

        ///The measurement noise initialization
        Matrix r1=Matrix::Identity(measurementSize,measurementSize)*0.0;
        GaussianWhiteNoise MeasurementNoise(imu.getMeasurementSize());
        MeasurementNoise.setStandardDeviation(r1);
        imu.setMeasurementNoise( & MeasurementNoise );
        r=r1*r1.transpose();

        ///the simulator initalization
        DynamicalSystemSimulator sim;
        sim.setDynamicsFunctor(&imu);

        ///initialization of the state vector
        Vector x0=Vector::Zero(stateSize,1);
        sim.setState(x0,0);

        ///construction of the input
        /// the input is constant over 10 time samples
        for (unsigned i=0;i<kmax/10;++i)
        {
            Vector uk=Vector::Zero(imu.getInputSize(),1);

            uk[0]=0.4 * sin(M_PI/10*i);
            uk[1]=0.6 * sin(M_PI/12*i);
            uk[2]=0.2 * sin(M_PI/5*i);

            uk[3]=10  * sin(M_PI/12*i);
            uk[4]=0.07  * sin(M_PI/15*i);
            uk[5]=0.05 * sin(M_PI/5*i);

            ///filling the 10 time samples of the constant input
            for (int j=0;j<10;++j)
            {
                u.setValue(uk,i*10+j);
            }

            ///give the input to the simulator
            ///we only need to give one value and the
            ///simulator takes automatically the appropriate value
            sim.setInput(uk,10*i);

        }

        ///set the sampling perdiod to the functor
        imu.setSamplingPeriod(dt);

        ///launched the simulation to the time kmax+1
        sim.simulateDynamicsTo(kmax+1);

        ///extract the array of measurements and states
        y = sim.getMeasurementArray(1,kmax);
        x = sim.getStateArray(1,kmax);
    }

    IndexedMatrixArray dta;

    for (unsigned i=x.getFirstIndex() ; i<=x.getLastIndex() ; ++i)
    {
        Vector xi = Vector::Zero(6,1);

        xi.head(3) = Vector(x[i]).segment(kine::pos,3);
        xi.tail(3) = Vector(x[i]).segment(kine::ori,3);

        dta.setValue(xi,i);
    }

    IndexedMatrixArray state = kine::reconstructStateTrajectory(dta,dt);

    ///file of output
    std::ofstream f;
    f.open("trajectory.dat");

    for (unsigned i=x.getFirstIndex() ; i<=x.getLastIndex() ; ++i)
    {
        //f<<dta[i].transpose()<<"\t#####\t\t"<<Vector(Vector(x[i]).segment(9,3)).transpose()<<"\t#####\t\t"<<(x[i]-state[i]).transpose()<<std::endl;
        f<<(x[i]-state[i])<<std::endl<<std::endl;
    }

    return 0;


}